

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Minefield_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Minefield_State_PDU::Encode(Minefield_State_PDU *this,KDataStream *stream)

{
  pointer pPVar1;
  pointer pEVar2;
  pointer pPVar3;
  pointer pEVar4;
  
  Minefield_Header::Encode(&this->super_Minefield_Header,stream);
  KDataStream::Write<unsigned_short>(stream,(this->m_SeqNumUnion).m_ui16SeqNum);
  KDataStream::Write(stream,this->m_ui8ForceID);
  KDataStream::Write(stream,this->m_ui8NumPerimPoints);
  (*(this->m_MinefieldType).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_MinefieldType,stream)
  ;
  KDataStream::Write<unsigned_short>(stream,this->m_ui16NumMineTypes);
  (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Loc,stream);
  (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Ori,stream);
  (*(this->m_App).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_App,stream);
  KDataStream::Write<unsigned_short>(stream,(this->m_ui16ProtocolModeUnion).m_ui16ProtocolMode16);
  pPVar1 = (this->m_vPoints).
           super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (this->m_vPoints).
                super__Vector_base<KDIS::DATA_TYPE::PerimeterPointCoordinate,_std::allocator<KDIS::DATA_TYPE::PerimeterPointCoordinate>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1; pPVar3 = pPVar3 + 1) {
    (*(pPVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pPVar3,stream);
  }
  pEVar2 = (this->m_vMineTypes).
           super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar4 = (this->m_vMineTypes).
                super__Vector_base<KDIS::DATA_TYPE::EntityType,_std::allocator<KDIS::DATA_TYPE::EntityType>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar4 != pEVar2; pEVar4 = pEVar4 + 1) {
    (*(pEVar4->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar4,stream);
  }
  return;
}

Assistant:

void Minefield_State_PDU::Encode( KDataStream & stream ) const
{
    Minefield_Header::Encode( stream );

    stream << m_SeqNumUnion.m_ui16SeqNum
           << m_ui8ForceID
           << m_ui8NumPerimPoints
           << KDIS_STREAM m_MinefieldType
           << m_ui16NumMineTypes
           << KDIS_STREAM m_Loc
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_App
           << m_ui16ProtocolModeUnion.m_ui16ProtocolMode16;

    std::vector<PerimeterPointCoordinate>::const_iterator citrPnt = m_vPoints.begin();
    std::vector<PerimeterPointCoordinate>::const_iterator citrEndPnt = m_vPoints.end();
    for( ; citrPnt != citrEndPnt; ++citrPnt )
    {
        citrPnt->Encode( stream );
    }

    std::vector<EntityType>::const_iterator citrTyp = m_vMineTypes.begin();
    std::vector<EntityType>::const_iterator citrEndTyp = m_vMineTypes.end();
    for( ; citrTyp != citrEndTyp; ++citrTyp )
    {
        citrTyp->Encode( stream );
    }
}